

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

float nite::getGeneralScale(void)

{
  Vec2 in_RAX;
  Vec2 local_18;
  Vec2 ns;
  
  if ((generalScale == -1.0) && (!NAN(generalScale))) {
    local_18 = in_RAX;
    Vec2::Vec2(&local_18,&::size);
    generalScale = ((local_18.x + local_18.y) * 0.5) / 1000.0;
  }
  return generalScale;
}

Assistant:

float nite::getGeneralScale(){
	if(generalScale == -1.0f){
	  auto ns = nite::getSize();
	  float cs = (ns.x + ns.y) * 0.5f;
	  float bs = (1280.0f + 720.0f) * 0.5f;
	  generalScale = cs / bs;
	}
	return generalScale;
}